

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  byte *pbVar1;
  ulong uVar2;
  mbedtls_pk_context *pk;
  mbedtls_md_type_t md_alg;
  short *psVar3;
  void *options;
  uint uVar4;
  byte bVar5;
  int iVar6;
  mbedtls_pk_type_t mVar7;
  int iVar8;
  size_t sVar9;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crt *pmVar11;
  mbedtls_md_info_t *md_info;
  uint32_t *puVar12;
  mbedtls_x509_crl *crl;
  uint uVar13;
  mbedtls_x509_buf *name;
  uint uVar14;
  mbedtls_asn1_named_data *pmVar15;
  bool bVar16;
  size_t local_150;
  size_t local_148;
  uint32_t *local_130;
  uint32_t cur_flags;
  x509_crt_verify_chain_item ver_chain [10];
  
  *flags = 0;
  memset(ver_chain,0,0xa0);
  if (profile != (mbedtls_x509_crt_profile *)0x0) {
    uVar13 = 0;
    if (cn != (char *)0x0) {
      sVar9 = strlen(cn);
      if ((crt->ext_types & 0x20) == 0) {
        pmVar15 = &crt->subject;
        do {
          if ((((pmVar15->oid).len == 3) &&
              (psVar3 = (short *)(pmVar15->oid).p, (char)psVar3[1] == '\x03' && *psVar3 == 0x455))
             && (iVar6 = x509_crt_check_cn(&pmVar15->val,cn,sVar9), iVar6 == 0)) goto LAB_0011d51e;
          pmVar15 = pmVar15->next;
        } while (pmVar15 != (mbedtls_asn1_named_data *)0x0);
      }
      else {
        name = &(crt->subject_alt_names).buf;
        do {
          iVar6 = x509_crt_check_cn(name,cn,sVar9);
          uVar13 = 0;
          if (iVar6 == 0) goto LAB_0011d51e;
          name = *(mbedtls_x509_buf **)(name + 1);
        } while (name != (mbedtls_x509_buf *)0x0);
      }
      ver_chain[0].flags = 4;
      uVar13 = 4;
    }
LAB_0011d51e:
    mVar7 = mbedtls_pk_get_type(&crt->pk);
    if ((profile->allowed_pks >> ((byte)((char)mVar7 - 1) & 0x1f) & 1) == 0) {
      uVar13 = uVar13 | 0x8000;
      ver_chain[0].flags = uVar13;
    }
    iVar6 = x509_profile_check_key(profile,&crt->pk);
    if (iVar6 != 0) {
      ver_chain[0].flags = uVar13 | 0x10000;
    }
    local_150 = 0;
    local_130 = &ver_chain[0].flags;
    bVar16 = false;
    local_148 = 0;
    do {
      puVar12 = &ver_chain[local_150].flags;
      ver_chain[local_150].crt = crt;
      iVar6 = mbedtls_x509_time_is_past(&crt->valid_to);
      if (iVar6 != 0) {
        *(byte *)puVar12 = (byte)*puVar12 | 1;
      }
      iVar6 = mbedtls_x509_time_is_future(&crt->valid_from);
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      uVar2 = local_150 + 1;
      if (bVar16) {
LAB_0011d9ad:
        if (uVar2 != 0) {
          goto LAB_0011d9d4;
        }
        uVar13 = *flags;
        goto LAB_0011da11;
      }
      if ((profile->allowed_mds >> ((byte)((char)crt->sig_md - MBEDTLS_MD_MD2) & 0x1f) & 1) == 0) {
        pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      if ((profile->allowed_pks >> ((byte)((char)crt->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) == 0) {
        pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
      if (local_150 == 0) {
        iVar6 = x509_name_cmp(&crt->issuer,&crt->subject);
        if ((iVar6 == 0) && (trust_ca != (mbedtls_x509_crt *)0x0)) {
          sVar9 = (crt->raw).len;
          pmVar11 = trust_ca;
          do {
            if ((sVar9 == (pmVar11->raw).len) &&
               (iVar6 = bcmp((crt->raw).p,(pmVar11->raw).p,sVar9), iVar6 == 0)) goto LAB_0011d9ad;
            pmVar11 = pmVar11->next;
          } while (pmVar11 != (mbedtls_x509_crt *)0x0);
        }
        bVar16 = true;
        pmVar11 = x509_crt_find_parent_in(crt,trust_ca,1,0,local_148);
        if (pmVar11 == (mbedtls_x509_crt *)0x0) {
          pmVar11 = x509_crt_find_parent_in(crt,crt->next,0,0,local_148);
          if (pmVar11 != (mbedtls_x509_crt *)0x0) goto LAB_0011d777;
          goto LAB_0011d9a5;
        }
      }
      else {
        pmVar10 = x509_crt_find_parent_in(crt,trust_ca,1,local_150,local_148);
        pmVar11 = pmVar10;
        if ((pmVar10 == (mbedtls_x509_crt *)0x0) &&
           (pmVar11 = x509_crt_find_parent_in(crt,crt->next,0,local_150,local_148),
           pmVar11 == (mbedtls_x509_crt *)0x0)) {
LAB_0011d9a5:
          *(byte *)puVar12 = (byte)*puVar12 | 8;
          goto LAB_0011d9ad;
        }
        iVar6 = x509_name_cmp(&crt->issuer,&crt->subject);
        local_148 = local_148 + (iVar6 == 0);
        if (pmVar10 == (mbedtls_x509_crt *)0x0) {
          if (8 < uVar2) goto LAB_0011da45;
LAB_0011d777:
          iVar6 = x509_crt_check_signature(crt,pmVar11);
          bVar16 = false;
          if (iVar6 != 0) {
            *(byte *)puVar12 = (byte)*puVar12 | 8;
          }
        }
        else {
          bVar16 = true;
        }
      }
      pk = &pmVar11->pk;
      iVar6 = x509_profile_check_key(profile,pk);
      if (iVar6 != 0) {
        pbVar1 = (byte *)((long)&ver_chain[local_150].flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      if (ca_crl == (mbedtls_x509_crl *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        crl = ca_crl;
        do {
          while (((crl->version == 0 ||
                  (sVar9 = (crl->issuer_raw).len, sVar9 != (pmVar11->subject_raw).len)) ||
                 (iVar6 = bcmp((crl->issuer_raw).p,(pmVar11->subject_raw).p,sVar9), iVar6 != 0))) {
            crl = crl->next;
            if (crl == (mbedtls_x509_crl *)0x0) goto LAB_0011d964;
          }
          if (((pmVar11->ext_types & 4) != 0) && ((pmVar11->key_usage & 0x8003) != 2)) {
            uVar13 = uVar13 | 0x10;
            break;
          }
          uVar14 = uVar13 | 0x20000;
          if ((profile->allowed_mds >> (crl->sig_md - MBEDTLS_MD_MD2 & 0x1f) & 1) != 0) {
            uVar14 = uVar13;
          }
          uVar4 = uVar14 | 0x40000;
          if ((profile->allowed_pks >> ((byte)((char)crl->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1) != 0
             ) {
            uVar4 = uVar14;
          }
          md_info = mbedtls_md_info_from_type(crl->sig_md);
          iVar6 = mbedtls_md(md_info,(crl->tbs).p,(crl->tbs).len,(uchar *)&cur_flags);
          uVar13 = uVar4;
          if (iVar6 != 0) {
LAB_0011d988:
            uVar13 = uVar13 | 0x10;
            break;
          }
          iVar6 = x509_profile_check_key(profile,pk);
          uVar13 = uVar4 | 0x10000;
          if (iVar6 == 0) {
            uVar13 = uVar4;
          }
          md_alg = crl->sig_md;
          mVar7 = crl->sig_pk;
          options = crl->sig_opts;
          bVar5 = mbedtls_md_get_size(md_info);
          iVar6 = mbedtls_pk_verify_ext
                            (mVar7,options,pk,md_alg,(uchar *)&cur_flags,(ulong)bVar5,(crl->sig).p,
                             (crl->sig).len);
          if (iVar6 != 0) goto LAB_0011d988;
          iVar6 = mbedtls_x509_time_is_past(&crl->next_update);
          uVar14 = uVar13 | 0x20;
          if (iVar6 == 0) {
            uVar14 = uVar13;
          }
          iVar6 = mbedtls_x509_time_is_future(&crl->this_update);
          uVar13 = uVar14 | 0x400;
          if (iVar6 == 0) {
            uVar13 = uVar14;
          }
          iVar6 = mbedtls_x509_crt_is_revoked(crt,crl);
          if (iVar6 != 0) {
            uVar13 = uVar13 | 2;
            break;
          }
          crl = crl->next;
        } while (crl != (mbedtls_x509_crl *)0x0);
      }
LAB_0011d964:
      *puVar12 = *puVar12 | uVar13;
      local_130 = local_130 + 4;
      crt = pmVar11;
      local_150 = uVar2;
    } while( true );
  }
  iVar8 = -0x2800;
LAB_0011da2c:
  *flags = 0xffffffff;
  return iVar8;
LAB_0011d9d4:
  cur_flags = *local_130;
  if ((f_vrfy != (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0) &&
     (iVar6 = (*f_vrfy)(p_vrfy,((x509_crt_verify_chain_item *)(local_130 + -2))->crt,(int)local_150,
                        &cur_flags), iVar6 != 0)) {
    iVar8 = -0x3000;
    if (iVar6 != -0x2700) {
      iVar8 = iVar6;
    }
    goto LAB_0011da2c;
  }
  uVar13 = cur_flags | *flags;
  *flags = uVar13;
  local_130 = local_130 + -4;
  bVar16 = local_150 == 0;
  local_150 = local_150 - 1;
  if (bVar16) {
LAB_0011da11:
    if (uVar13 != 0) {
      return -0x2700;
    }
    return 0;
  }
  goto LAB_0011d9d4;
LAB_0011da45:
  iVar8 = -0x3000;
  goto LAB_0011da2c;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    int ret;
    mbedtls_pk_type_t pk_type;
    x509_crt_verify_chain_item ver_chain[X509_MAX_VERIFY_CHAIN_SIZE];
    size_t chain_len;
    uint32_t *ee_flags = &ver_chain[0].flags;

    *flags = 0;
    memset( ver_chain, 0, sizeof( ver_chain ) );
    chain_len = 0;

    if( profile == NULL )
    {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if( cn != NULL )
        x509_crt_verify_name( crt, cn, ee_flags );

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, &crt->pk ) != 0 )
        *ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Check the chain */
    ret = x509_crt_verify_chain( crt, trust_ca, ca_crl, profile,
                                 ver_chain, &chain_len );
    if( ret != 0 )
        goto exit;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb( flags,
                                        ver_chain, chain_len, f_vrfy, p_vrfy );

exit:
    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if( ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED )
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;

    if( ret != 0 )
    {
        *flags = (uint32_t) -1;
        return( ret );
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}